

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io-test.c++
# Opt level: O3

void __thiscall kj::anon_unknown_0::TestCase745::run(TestCase745 *this)

{
  ReadableFile *pRVar1;
  undefined8 uVar2;
  size_t sVar3;
  char *pcVar4;
  String *pSVar5;
  Own<kj::Directory,_std::nullptr_t> OVar6;
  StringPtr text;
  Own<const_kj::File,_std::nullptr_t> file;
  Own<kj::Directory,_std::nullptr_t> dir;
  DebugComparison<kj::String,_const_char_(&)[7]> _kjCondition;
  TempDir tempDir;
  undefined8 *local_b8;
  ReadableFile *local_b0;
  undefined1 local_a8 [24];
  size_t sStack_90;
  ArrayDisposer *pAStack_88;
  String local_78;
  DebugComparison<kj::Array<kj::String>,_std::nullptr_t> local_58;
  TempDir local_20;
  
  TempDir::TempDir(&local_20);
  OVar6 = TempDir::get((TempDir *)local_a8);
  (**(code **)(*(long *)local_a8._8_8_ + 0x78))(&local_b8,local_a8._8_8_,OVar6.ptr);
  text.content.size_ = 7;
  text.content.ptr = "foobar";
  File::writeAll((File *)local_b0,text);
  ReadableFile::readAllText(&local_78,local_b0);
  local_a8._16_8_ = local_78.content.ptr;
  sStack_90 = local_78.content.size_;
  pAStack_88 = local_78.content.disposer;
  local_78.content.ptr = (char *)0x0;
  local_78.content.size_ = 0;
  kj::_::DebugExpression<kj::String>::operator==
            ((DebugComparison<kj::String,_const_char_(&)[7]> *)&local_58,
             (DebugExpression<kj::String> *)(local_a8 + 0x10),(char (*) [7])0x4d937d);
  sVar3 = sStack_90;
  uVar2 = local_a8._16_8_;
  if ((String *)local_a8._16_8_ != (String *)0x0) {
    local_a8._16_8_ = (String *)0x0;
    sStack_90 = 0;
    (**pAStack_88->_vptr_ArrayDisposer)(pAStack_88,uVar2,1,sVar3,sVar3,0);
  }
  sVar3 = local_78.content.size_;
  pcVar4 = local_78.content.ptr;
  if (local_78.content.ptr != (char *)0x0) {
    local_78.content.ptr = (char *)0x0;
    local_78.content.size_ = 0;
    (**(local_78.content.disposer)->_vptr_ArrayDisposer)
              (local_78.content.disposer,pcVar4,1,sVar3,sVar3,0);
  }
  if ((local_58.result == false) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[49],kj::_::DebugComparison<kj::String,char_const(&)[7]>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem-disk-test.c++"
               ,0x2ee,ERROR,
               "\"failed: expected \" \"file->readAllText() == \\\"foobar\\\"\", _kjCondition",
               (char (*) [49])"failed: expected file->readAllText() == \"foobar\"",
               (DebugComparison<kj::String,_const_char_(&)[7]> *)&local_58);
  }
  sVar3 = local_58.left.size_;
  pSVar5 = local_58.left.ptr;
  if (local_58.left.ptr != (String *)0x0) {
    local_58.left.ptr = (String *)0x0;
    local_58.left.size_ = 0;
    (**(local_58.left.disposer)->_vptr_ArrayDisposer)(local_58.left.disposer,pSVar5,1,sVar3,sVar3,0)
    ;
  }
  (**(code **)(*(long *)local_a8._8_8_ + 0x30))(local_a8 + 0x10);
  local_58.left.ptr = (String *)local_a8._16_8_;
  local_58.left.size_ = sStack_90;
  local_58.left.disposer = pAStack_88;
  local_58.right = (void *)0x0;
  local_58.op.content.ptr = " == ";
  local_58.op.content.size_ = 5;
  local_58.result = sStack_90 == 0;
  if ((!local_58.result) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::
    log<char_const(&)[45],kj::_::DebugComparison<kj::Array<kj::String>,decltype(nullptr)>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem-disk-test.c++"
               ,0x2ef,ERROR,"\"failed: expected \" \"dir->listNames() == nullptr\", _kjCondition",
               (char (*) [45])"failed: expected dir->listNames() == nullptr",&local_58);
  }
  sVar3 = local_58.left.size_;
  pSVar5 = local_58.left.ptr;
  if (local_58.left.ptr != (String *)0x0) {
    local_58.left.ptr = (String *)0x0;
    local_58.left.size_ = 0;
    (**(local_58.left.disposer)->_vptr_ArrayDisposer)
              (local_58.left.disposer,pSVar5,0x18,sVar3,sVar3,
               ArrayDisposer::Dispose_<kj::String>::destruct);
  }
  pRVar1 = local_b0;
  if (local_b0 != (ReadableFile *)0x0) {
    local_b0 = (ReadableFile *)0x0;
    (**(code **)*local_b8)
              (local_b8,(pRVar1->super_FsNode)._vptr_FsNode[-2] + (long)&pRVar1->super_FsNode);
  }
  uVar2 = local_a8._8_8_;
  if ((long *)local_a8._8_8_ != (long *)0x0) {
    local_a8._8_8_ = (long *)0x0;
    (*(code *)**(undefined8 **)local_a8._0_8_)
              (local_a8._0_8_,uVar2 + *(long *)(*(long *)uVar2 + -0x10));
  }
  TempDir::~TempDir(&local_20);
  return;
}

Assistant:

TEST(AsyncIo, ScmRightsTruncatedOdd) {
  // Test that if we send two FDs over a unix socket, but the receiving end only receives one, we
  // don't leak the other FD.

  auto io = setupAsyncIo();

  auto capPipe = io.provider->newCapabilityPipe();

  int pipeFds[2]{};
  KJ_SYSCALL(miniposix::pipe(pipeFds));
  kj::OwnFd in1(pipeFds[0]);
  kj::OwnFd out1(pipeFds[1]);

  KJ_SYSCALL(miniposix::pipe(pipeFds));
  kj::OwnFd in2(pipeFds[0]);
  kj::OwnFd out2(pipeFds[1]);

  {
    OwnFd sendFds[2] = { kj::mv(out1), kj::mv(out2) };
    capPipe.ends[0]->writeWithFds("foo"_kjb, nullptr, sendFds).wait(io.waitScope);
  }

  {
    char buffer[4]{};
    OwnFd fdBuffer[1];
    auto result = capPipe.ends[1]->tryReadWithFds(buffer, 3, 3, fdBuffer, 1).wait(io.waitScope);
    KJ_ASSERT(result.capCount == 1);
    kj::FdOutputStream(fdBuffer[0].get()).write("bar"_kjb);
  }

  // We want to carefully verify that out1 and out2 were closed, without deadlocking if they
  // weren't. So we manually set nonblocking mode and then issue read()s.
  KJ_SYSCALL(fcntl(in1, F_SETFL, O_NONBLOCK));
  KJ_SYSCALL(fcntl(in2, F_SETFL, O_NONBLOCK));

  char buffer[4]{};
  ssize_t n;

  // First we read "bar" from in1.
  KJ_NONBLOCKING_SYSCALL(n = read(in1, buffer, 4));
  KJ_ASSERT(n == 3);
  buffer[3] = '\0';
  KJ_ASSERT(kj::StringPtr(buffer) == "bar");

  // Now it should be EOF.
  KJ_NONBLOCKING_SYSCALL(n = read(in1, buffer, 4));
  if (n < 0) {
    KJ_FAIL_ASSERT("out1 was not closed");
  }
  KJ_ASSERT(n == 0);

  // Second pipe should have been closed implicitly because we didn't provide space to receive it.
  KJ_NONBLOCKING_SYSCALL(n = read(in2, buffer, 4));
  if (n < 0) {
    KJ_FAIL_ASSERT("out2 was not closed. This could indicate that your operating system kernel is "
        "buggy and leaks file descriptors when an SCM_RIGHTS message is truncated. FreeBSD was "
        "known to do this until late 2018, while MacOS still has this bug as of this writing in "
        "2019. However, KJ works around the problem on those platforms. You need to enable the "
        "same work-around for your OS -- search for 'SCM_RIGHTS' in src/kj/async-io-unix.c++.");
  }
  KJ_ASSERT(n == 0);
}